

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdjs_address_base.cpp
# Opt level: O3

CreateAddressResponseStruct *
cfd::js::api::AddressApiBase::CreateAddress
          (CreateAddressResponseStruct *__return_storage_ptr__,CreateAddressRequestStruct *request,
          AddressFactory *address_factory)

{
  _Rb_tree_header *p_Var1;
  HashKeyDataStruct *pHVar2;
  string *psVar3;
  _func_int **pp_Var4;
  undefined8 uVar5;
  char cVar6;
  AddressType AVar7;
  int iVar8;
  Script redeem_script;
  Script locking_script;
  Script script;
  Address addr;
  undefined1 local_3f8 [24];
  _func_int **local_3e0;
  undefined1 local_3c8 [32];
  uchar local_3a8 [16];
  void *local_398;
  void *local_380;
  void *local_368;
  code *local_350 [15];
  vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> local_2d8;
  Script local_2c0;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_280;
  Script local_250;
  Script local_218;
  Script local_1e0;
  Address local_1a8 [16];
  undefined1 *local_198;
  undefined1 local_188 [16];
  void *local_178;
  void *local_160;
  void *local_148;
  code *local_130 [15];
  vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> local_b8;
  Script local_a0;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_60;
  
  (__return_storage_ptr__->address)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->address).field_2;
  (__return_storage_ptr__->address)._M_string_length = 0;
  (__return_storage_ptr__->address).field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->locking_script)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->locking_script).field_2;
  (__return_storage_ptr__->locking_script)._M_string_length = 0;
  (__return_storage_ptr__->locking_script).field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->redeem_script)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->redeem_script).field_2;
  (__return_storage_ptr__->redeem_script)._M_string_length = 0;
  (__return_storage_ptr__->redeem_script).field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->error).code = 0;
  (__return_storage_ptr__->error).type._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->error).type.field_2;
  (__return_storage_ptr__->error).type._M_string_length = 0;
  (__return_storage_ptr__->error).type.field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->error).message._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->error).message.field_2;
  (__return_storage_ptr__->error).message._M_string_length = 0;
  (__return_storage_ptr__->error).message.field_2._M_local_buf[0] = '\0';
  p_Var1 = &(__return_storage_ptr__->error).ignore_items._M_t._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->error).ignore_items._M_t._M_impl.super__Rb_tree_header._M_header._M_color
       = _S_red;
  (__return_storage_ptr__->error).ignore_items._M_t._M_impl.super__Rb_tree_header._M_header.
  _M_parent = (_Base_ptr)0x0;
  (__return_storage_ptr__->error).ignore_items._M_t._M_impl.super__Rb_tree_header._M_header._M_left
       = &p_Var1->_M_header;
  (__return_storage_ptr__->error).ignore_items._M_t._M_impl.super__Rb_tree_header._M_header._M_right
       = &p_Var1->_M_header;
  (__return_storage_ptr__->error).ignore_items._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(__return_storage_ptr__->ignore_items)._M_t._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
       _S_red;
  (__return_storage_ptr__->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (__return_storage_ptr__->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (__return_storage_ptr__->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (__return_storage_ptr__->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  cfd::core::Address::Address(local_1a8);
  cfd::core::Pubkey::Pubkey((Pubkey *)local_3f8);
  cfd::core::Script::Script(&local_1e0);
  cfd::core::Script::Script(&local_218);
  cfd::core::Script::Script(&local_250);
  AVar7 = ConvertAddressType(&request->hash_type);
  pHVar2 = &request->key_data;
  psVar3 = &(request->key_data).type;
  iVar8 = std::__cxx11::string::compare((char *)psVar3);
  if (iVar8 == 0) {
    if ((AVar7 == kTaprootAddress) && ((request->key_data).hex._M_string_length == 0x40)) {
      cfd::core::SchnorrPubkey::SchnorrPubkey((SchnorrPubkey *)&local_3e0,(string *)pHVar2);
      cfd::core::SchnorrPubkey::CreatePubkey(SUB81(local_3c8,0));
      uVar5 = local_3f8._0_8_;
      local_3f8._0_8_ = local_3c8._0_8_;
      local_3f8._8_8_ = local_3c8._8_8_;
      local_3f8._16_8_ = local_3c8._16_8_;
      local_3c8._0_8_ = (_func_int **)0x0;
      local_3c8._8_8_ = (pointer)0x0;
      local_3c8._16_8_ = (uchar *)0x0;
      if (((_func_int **)uVar5 != (_func_int **)0x0) &&
         (operator_delete((void *)uVar5), (_func_int **)local_3c8._0_8_ != (_func_int **)0x0)) {
        operator_delete((void *)local_3c8._0_8_);
      }
    }
    else {
      cfd::core::Pubkey::Pubkey((Pubkey *)local_3c8,(string *)pHVar2);
      uVar5 = local_3f8._0_8_;
      local_3f8._0_8_ = local_3c8._0_8_;
      local_3f8._8_8_ = local_3c8._8_8_;
      local_3f8._16_8_ = local_3c8._16_8_;
      local_3c8._0_8_ = (_func_int **)0x0;
      local_3c8._8_8_ = (pointer)0x0;
      local_3c8._16_8_ = (uchar *)0x0;
      if ((_func_int **)uVar5 == (_func_int **)0x0) goto LAB_0071ef8b;
      operator_delete((void *)uVar5);
      local_3e0 = (_func_int **)local_3c8._0_8_;
    }
    if (local_3e0 != (_func_int **)0x0) {
      operator_delete(local_3e0);
    }
  }
  else {
    iVar8 = std::__cxx11::string::compare((char *)psVar3);
    if (iVar8 == 0) {
      cfd::core::Script::Script((Script *)local_3c8,(string *)pHVar2);
      cfd::core::Script::operator=(&local_1e0,(Script *)local_3c8);
      core::Script::~Script((Script *)local_3c8);
    }
  }
LAB_0071ef8b:
  cfd::AddressFactory::CreateAddress
            ((AddressType)local_3c8,(Pubkey *)address_factory,(Script *)(ulong)AVar7,
             (Script *)local_3f8,&local_1e0);
  cfd::core::Address::operator=(local_1a8,(Address *)local_3c8);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_280);
  core::Script::~Script(&local_2c0);
  local_350[0] = cfd::core::Privkey::Privkey;
  std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector(&local_2d8);
  core::TapBranch::~TapBranch((TapBranch *)local_350);
  if (local_368 != (void *)0x0) {
    operator_delete(local_368);
  }
  if (local_380 != (void *)0x0) {
    operator_delete(local_380);
  }
  if (local_398 != (void *)0x0) {
    operator_delete(local_398);
  }
  if ((uchar *)local_3c8._16_8_ != local_3a8) {
    operator_delete((void *)local_3c8._16_8_);
  }
  (__return_storage_ptr__->error).code = 0;
  cfd::core::Address::GetAddress_abi_cxx11_();
  std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)local_3c8);
  pp_Var4 = (_func_int **)(local_3c8 + 0x10);
  if ((_func_int **)local_3c8._0_8_ != pp_Var4) {
    operator_delete((void *)local_3c8._0_8_);
  }
  cfd::core::Script::GetHex_abi_cxx11_();
  std::__cxx11::string::_M_assign((string *)&__return_storage_ptr__->locking_script);
  if ((_func_int **)local_3c8._0_8_ != pp_Var4) {
    operator_delete((void *)local_3c8._0_8_);
  }
  cVar6 = cfd::core::Script::IsEmpty();
  if (cVar6 == '\0') {
    cfd::core::Script::GetHex_abi_cxx11_();
    std::__cxx11::string::_M_assign((string *)&__return_storage_ptr__->redeem_script);
  }
  else {
    local_3c8._0_8_ = pp_Var4;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_3c8,"redeemScript","");
    std::
    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    ::_M_insert_unique<std::__cxx11::string>
              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)&__return_storage_ptr__->ignore_items,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3c8);
  }
  if ((_func_int **)local_3c8._0_8_ != pp_Var4) {
    operator_delete((void *)local_3c8._0_8_);
  }
  core::Script::~Script(&local_250);
  core::Script::~Script(&local_218);
  core::Script::~Script(&local_1e0);
  if ((_func_int **)local_3f8._0_8_ != (_func_int **)0x0) {
    operator_delete((void *)local_3f8._0_8_);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_60);
  core::Script::~Script(&local_a0);
  local_130[0] = cfd::core::Privkey::Privkey;
  std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector(&local_b8);
  core::TapBranch::~TapBranch((TapBranch *)local_130);
  if (local_148 != (void *)0x0) {
    operator_delete(local_148);
  }
  if (local_160 != (void *)0x0) {
    operator_delete(local_160);
  }
  if (local_178 != (void *)0x0) {
    operator_delete(local_178);
  }
  if (local_198 != local_188) {
    operator_delete(local_198);
  }
  return __return_storage_ptr__;
}

Assistant:

CreateAddressResponseStruct AddressApiBase::CreateAddress(
    const CreateAddressRequestStruct& request,
    const AddressFactory* address_factory) {
  CreateAddressResponseStruct response;
  Address addr;
  Pubkey pubkey;
  Script script;
  Script locking_script;
  Script redeem_script;
  AddressType addr_type = ConvertAddressType(request.hash_type);

  if (request.key_data.type == "pubkey") {
    if ((addr_type == AddressType::kTaprootAddress) &&
        (request.key_data.hex.length() ==
         SchnorrPubkey::kSchnorrPubkeySize * 2)) {
      pubkey = SchnorrPubkey(request.key_data.hex).CreatePubkey();
    } else {
      pubkey = Pubkey(request.key_data.hex);
    }
  } else if (request.key_data.type == "redeem_script") {
    script = Script(request.key_data.hex);
  }

  addr = address_factory->CreateAddress(
      addr_type, &pubkey, &script, &locking_script, &redeem_script);

  response.error.code = 0;
  response.address = addr.GetAddress();
  response.locking_script = locking_script.GetHex();
  if (redeem_script.IsEmpty()) {
    response.ignore_items.insert("redeemScript");
  } else {
    response.redeem_script = redeem_script.GetHex();
  }
  return response;
}